

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitCall
          (Flow *__return_storage_ptr__,
          ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *this,Call *curr)

{
  unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
  *__ht;
  Module *this_00;
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  Signature SVar6;
  undefined1 local_c8 [8];
  unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
  prevLocalValues;
  undefined1 local_88 [8];
  Flow retFlow;
  key_type local_34;
  
  if ((((((this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>).field_0x1c & 2) != 0)
       && (this_00 = (this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>).module,
          this_00 != (Module *)0x0)) &&
      (prevLocalValues._M_h._M_single_bucket =
            (__node_base_ptr)Module::getFunction(this_00,(Name)(curr->target).super_IString.str),
      (((Function *)prevLocalValues._M_h._M_single_bucket)->super_Importable).module.super_IString.
      str._M_str == (char *)0x0)) &&
     (SVar6 = HeapType::getSignature(&((Function *)prevLocalValues._M_h._M_single_bucket)->type),
     1 < SVar6.results.id.id)) {
    uVar1 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    sVar3 = Function::getNumParams((Function *)prevLocalValues._M_h._M_single_bucket);
    if (uVar1 != sVar3) {
      __assert_fail("numOperands == func->getNumParams()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x85e,
                    "Flow wasm::ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitCall(Call *) [SubType = wasm::PrecomputingExpressionRunner]"
                   );
    }
    __ht = &this->localValues;
    local_88 = (undefined1  [8])local_c8;
    local_c8 = (undefined1  [8])0x0;
    prevLocalValues._M_h._M_buckets = (__buckets_ptr)(this->localValues)._M_h._M_bucket_count;
    prevLocalValues._M_h._M_bucket_count = 0;
    prevLocalValues._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)(this->localValues)._M_h._M_element_count;
    prevLocalValues._M_h._M_element_count = *(size_type *)&(this->localValues)._M_h._M_rehash_policy
    ;
    prevLocalValues._M_h._M_rehash_policy._0_8_ =
         (this->localValues)._M_h._M_rehash_policy._M_next_resize;
    prevLocalValues._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Literals>,std::allocator<std::pair<unsigned_int_const,wasm::Literals>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Literals>,std::allocator<std::pair<unsigned_int_const,wasm::Literals>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Literals>,false>>>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Literals>,std::allocator<std::pair<unsigned_int_const,wasm::Literals>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_88,&__ht->_M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Literals>,_false>_>_>
                *)local_88);
    retFlow.breakTo.super_IString.str._M_str = (char *)__ht;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&__ht->_M_h);
    local_34 = 0;
    if (uVar1 != 0) {
      uVar4 = 0;
      do {
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar4) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        ExpressionRunner<wasm::PrecomputingExpressionRunner>::visit
                  ((Flow *)local_88,
                   &this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>,
                   (curr->operands).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                   [uVar4]);
        if (retFlow.breakTo.super_IString.str._M_len == 0) {
          if ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Literals>,std::allocator<std::pair<unsigned_int_const,wasm::Literals>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)((long)local_88 +
                 ((long)((long)retFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                               _M_impl.super__Vector_impl_data._M_start -
                        retFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
                        id) >> 3) * -0x5555555555555555) ==
              (_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Literals>,std::allocator<std::pair<unsigned_int_const,wasm::Literals>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)0x0) {
            __assert_fail("argFlow.values.isConcrete()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                          ,0x864,
                          "Flow wasm::ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitCall(Call *) [SubType = wasm::PrecomputingExpressionRunner]"
                         );
          }
          pmVar5 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)retFlow.breakTo.super_IString.str._M_str,&local_34);
          (pmVar5->super_SmallVector<wasm::Literal,_1UL>).usedFixed = (size_t)local_88;
          Literal::operator=((pmVar5->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                             (Literal *)&retFlow);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator=
                    (&(pmVar5->super_SmallVector<wasm::Literal,_1UL>).flexible,
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                     &retFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &retFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
        Literal::~Literal((Literal *)&retFlow);
        local_34 = local_34 + 1;
        uVar4 = (ulong)local_34;
      } while (uVar4 < uVar1);
    }
    ExpressionRunner<wasm::PrecomputingExpressionRunner>::visit
              ((Flow *)local_88,&this->super_ExpressionRunner<wasm::PrecomputingExpressionRunner>,
               (Expression *)prevLocalValues._M_h._M_single_bucket[0xc]._M_nxt);
    if (local_c8 != retFlow.breakTo.super_IString.str._M_str) {
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Literals>,std::allocator<std::pair<unsigned_int_const,wasm::Literals>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Literals>,std::allocator<std::pair<unsigned_int_const,wasm::Literals>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Literals>,std::allocator<std::pair<unsigned_int_const,wasm::Literals>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)retFlow.breakTo.super_IString.str._M_str,
                 (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)local_c8);
    }
    if (retFlow.breakTo.super_IString.str._M_len == DAT_00dbd0c0) {
      Flow::Flow(__return_storage_ptr__,(Literals *)local_88);
    }
    else {
      if (retFlow.breakTo.super_IString.str._M_len != 0) {
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &retFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
        Literal::~Literal((Literal *)&retFlow);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_c8);
        goto LAB_0083d432;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)local_88);
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &retFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    Literal::~Literal((Literal *)&retFlow);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_c8);
    return __return_storage_ptr__;
  }
LAB_0083d432:
  pcVar2 = DAT_00dbd0d0;
  sVar3 = NONCONSTANT_FLOW;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar3;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar2;
  return __return_storage_ptr__;
}

Assistant:

Flow visitCall(Call* curr) {
    NOTE_ENTER("Call");
    NOTE_NAME(curr->target);
    // Traverse into functions using the same mode, which we can also do
    // when replacing as long as the function does not have any side effects.
    // Might yield something useful for simple functions like `clamp`, sometimes
    // even if arguments are only partially constant or not constant at all.
    if ((flags & FlagValues::TRAVERSE_CALLS) != 0 && this->module != nullptr) {
      auto* func = this->module->getFunction(curr->target);
      if (!func->imported()) {
        if (func->getResults().isConcrete()) {
          auto numOperands = curr->operands.size();
          assert(numOperands == func->getNumParams());
          auto prevLocalValues = localValues;
          localValues.clear();
          for (Index i = 0; i < numOperands; ++i) {
            auto argFlow = ExpressionRunner<SubType>::visit(curr->operands[i]);
            if (!argFlow.breaking()) {
              assert(argFlow.values.isConcrete());
              localValues[i] = argFlow.values;
            }
          }
          auto retFlow = ExpressionRunner<SubType>::visit(func->body);
          localValues = prevLocalValues;
          if (retFlow.breakTo == RETURN_FLOW) {
            return Flow(retFlow.values);
          } else if (!retFlow.breaking()) {
            return retFlow;
          }
        }
      }
    }
    return Flow(NONCONSTANT_FLOW);
  }